

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

void __thiscall sptk::swipe::printm(swipe *this,matrix yr_matrix)

{
  ulong uVar1;
  ulong uVar2;
  
  if (0 < (int)(uint)this) {
    uVar2 = 0;
    do {
      if (0xffffffff < (long)this) {
        uVar1 = 0;
        do {
          printf("%f\t",*(undefined8 *)(*(long *)(yr_matrix._0_8_ + uVar2 * 8) + uVar1 * 8));
          uVar1 = uVar1 + 1;
        } while ((ulong)this >> 0x20 != uVar1);
      }
      putchar(10);
      uVar2 = uVar2 + 1;
    } while (uVar2 != ((uint)this & 0x7fffffff));
  }
  return;
}

Assistant:

void printm(matrix yr_matrix) {
    int i, j;
    for (i = 0; i < yr_matrix.x; i++) {
        for (j = 0; j < yr_matrix.y; j++)
            printf("%f\t", yr_matrix.m[i][j]);
        printf("\n");
    }
}